

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.hpp
# Opt level: O2

void __thiscall
websocketpp::http::parser::response::process(response *this,iterator begin,iterator end)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  long *plVar3;
  exception *peVar4;
  allocator local_219;
  string local_218;
  int code;
  string local_1f0;
  string local_1d0;
  istringstream ss;
  undefined7 uStack_1af;
  char local_1a0 [368];
  
  ss = (istringstream)0x20;
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (begin._M_current,end._M_current);
  if (_Var1._M_current == end._M_current) {
    peVar4 = (exception *)__cxa_allocate_exception(0x70);
    std::__cxx11::string::string((string *)&ss,"Invalid response line",(allocator *)&local_1d0);
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    local_218._M_string_length = 0;
    local_1f0._M_string_length = 0;
    local_218.field_2._M_local_buf[0] = '\0';
    local_1f0.field_2._M_local_buf[0] = '\0';
    exception::exception(peVar4,(string *)&ss,bad_request,&local_218,&local_1f0);
    __cxa_throw(peVar4,&exception::typeinfo,exception::~exception);
  }
  _ss = local_1a0;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((string *)&ss,begin._M_current,_Var1._M_current);
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::~string((string *)&ss);
  ss = (istringstream)0x20;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (_Var1._M_current + 1,end._M_current,&ss);
  if (_Var2._M_current != end._M_current) {
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&local_218,_Var1._M_current + 1,_Var2._M_current);
    std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)&local_218,_S_in);
    std::__cxx11::string::~string((string *)&local_218);
    plVar3 = (long *)std::istream::operator>>(&ss,&code);
    if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((string *)&local_218,_Var2._M_current + 1,end._M_current);
      this->m_status_code = code;
      std::__cxx11::string::_M_assign((string *)&this->m_status_msg);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
      return;
    }
    peVar4 = (exception *)__cxa_allocate_exception(0x70);
    std::__cxx11::string::string((string *)&local_218,"Unable to parse response code",&local_219);
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    local_1f0._M_string_length = 0;
    local_1d0._M_string_length = 0;
    local_1f0.field_2._M_local_buf[0] = '\0';
    local_1d0.field_2._M_local_buf[0] = '\0';
    exception::exception(peVar4,&local_218,bad_request,&local_1f0,&local_1d0);
    __cxa_throw(peVar4,&exception::typeinfo,exception::~exception);
  }
  peVar4 = (exception *)__cxa_allocate_exception(0x70);
  std::__cxx11::string::string((string *)&ss,"Invalid request line",(allocator *)&local_1d0);
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  local_218._M_string_length = 0;
  local_1f0._M_string_length = 0;
  local_218.field_2._M_local_buf[0] = '\0';
  local_1f0.field_2._M_local_buf[0] = '\0';
  exception::exception(peVar4,(string *)&ss,bad_request,&local_218,&local_1f0);
  __cxa_throw(peVar4,&exception::typeinfo,exception::~exception);
}

Assistant:

inline void response::process(std::string::iterator begin,
    std::string::iterator end)
{
    std::string::iterator cursor_start = begin;
    std::string::iterator cursor_end = std::find(begin,end,' ');

    if (cursor_end == end) {
        throw exception("Invalid response line",status_code::bad_request);
    }

    set_version(std::string(cursor_start,cursor_end));

    cursor_start = cursor_end+1;
    cursor_end = std::find(cursor_start,end,' ');

    if (cursor_end == end) {
        throw exception("Invalid request line",status_code::bad_request);
    }

    int code;

    std::istringstream ss(std::string(cursor_start,cursor_end));

    if ((ss >> code).fail()) {
        throw exception("Unable to parse response code",status_code::bad_request);
    }

    set_status(status_code::value(code),std::string(cursor_end+1,end));
}